

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  float fVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  GLenum GVar10;
  GLint GVar11;
  GLint GVar12;
  uint uVar13;
  long lVar14;
  ostream *poVar15;
  size_t sVar16;
  int *piVar17;
  string *path;
  string *psVar18;
  string *psVar19;
  char *pcVar20;
  GLFWwindow *handle;
  bool bVar21;
  const_iterator __end2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  GLuint VBO;
  GLuint EBO;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fragment_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_evaluation_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tess_control_shader_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vertex_shader_paths;
  allocator_type local_152;
  allocator local_151;
  GLFWwindow *local_150;
  double local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  char **local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  double local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  double local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_120 = argv;
  iVar9 = glfwInit();
  if (iVar9 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not initialize glfw",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    iVar9 = 1;
    std::ostream::flush();
  }
  else {
    glfwSetErrorCallback(main::anon_class_1_0_00000001::__invoke);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    local_150 = glfwCreateWindow(width,height,"shader-pipeline",(GLFWmonitor *)0x0,(GLFWwindow *)0x0
                                );
    if (local_150 == (GLFWwindow *)0x0) {
      glfwTerminate();
      lVar14 = 0x1c;
      pcVar20 = "Could not create glfw window";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "\nUsage:\n  [Click and drag]  to orbit view\n  [Scroll]  to translate view in and out\n  A,a  toggle animation\n  L,l  toggle wireframe rending\n  Z,z  reset view to look along z-axis\n"
                 ,0xb2);
      glfwSetWindowPos(local_150,0,0);
      glfwMakeContextCurrent(local_150);
      iVar9 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar9 != 0) {
        print_opengl_info(local_150);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"init","");
        GVar10 = (*glad_glGetError)();
        if (GVar10 != 0) {
          main_cold_1();
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
                  (&V.super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>,
                   &F.super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>);
        (*glad_glGenVertexArrays)(1,&VAO);
        (*glad_glGenBuffers)(1,(GLuint *)&local_140);
        (*glad_glGenBuffers)(1,(GLuint *)&local_118);
        (*glad_glBindVertexArray)(VAO);
        (*glad_glBindBuffer)(0x8892,(GLuint)local_140._M_dataplus._M_p);
        (*glad_glBufferData)
                  (0x8892,V.super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>.m_storage.
                          m_rows * 0xc,
                   V.super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>.m_storage.m_data,
                   0x88e4);
        (*glad_glBindBuffer)
                  (0x8893,(GLuint)local_118.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        (*glad_glBufferData)
                  (0x8893,CONCAT44(F.
                                   super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>
                                   .m_storage.m_rows._4_4_,
                                   (int)F.
                                        super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>
                                        .m_storage.m_rows) * 0xc,
                   F.super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>.m_storage.
                   m_data,0x88e4);
        (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(0);
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindVertexArray)(0);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"mesh_to_vao","");
        GVar10 = (*glad_glGetError)();
        handle = local_150;
        if (GVar10 != 0) {
          main_cold_2();
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
        glfwSetWindowSizeCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwGetWindowSize(handle,(int *)&local_140,(int *)&local_118);
        width = (GLuint)local_140._M_dataplus._M_p;
        height = (GLuint)local_118.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        fVar2 = ((float)(int)(GLuint)local_140._M_dataplus._M_p * 0.003152988) /
                (float)(int)(GLuint)local_118.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc]
             = 0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
             = 0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
             0.02 / (fVar2 + fVar2);
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
             3.1715946;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
             0.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
             (fVar2 - fVar2) / (fVar2 + fVar2);
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
             = -1.0002;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
             = -1.0;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe]
             = -0.020002;
        proj.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
             = 0.0;
        glfwSetKeyCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetCharModsCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetMouseButtonCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetCursorPosCallback(handle,main::anon_class_1_0_00000001::__invoke);
        glfwSetScrollCallback(handle,main::anon_class_1_0_00000001::__invoke);
        (*glad_glEnable)(0xb71);
        (*glad_glEnable)(0xb44);
        std::chrono::_V2::system_clock::now();
        local_100 = 0.0;
        local_148 = 0.0;
LAB_0011f9a8:
        iVar9 = glfwWindowShouldClose(handle);
        if (iVar9 == 0) {
          lVar14 = std::chrono::_V2::system_clock::now();
          local_78 = (double)lVar14 / 1000000000.0;
          std::__cxx11::string::string((string *)&local_140,local_120[1],&local_151);
          __l._M_len = 1;
          __l._M_array = &local_140;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_118,__l,&local_152);
          pbVar6 = local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar18 = (string *)
                         CONCAT44(local_118.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (GLuint)local_118.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
              psVar18 != pbVar6; psVar18 = psVar18 + 1) {
            dVar1 = last_modification_time(psVar18);
            if (local_100 < dVar1) {
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(psVar18->_M_dataplus)._M_p,
                                   psVar18->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," has changed since last compilation attempt.",0x2c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              std::ostream::put((char)poVar15);
              bVar8 = true;
              std::ostream::flush();
              goto LAB_0011fa87;
            }
          }
          bVar8 = false;
LAB_0011fa87:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          psVar19 = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar18 = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar8) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"-----------------------------------------------",0x2f)
            ;
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            lVar14 = std::chrono::_V2::system_clock::now();
            local_100 = (double)lVar14 / 1000000000.0;
            std::__cxx11::string::string((string *)&local_140,local_120[1],(allocator *)&local_118);
            bVar8 = read_json(&local_140,&local_98,&local_b8,&local_d8,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            local_148 = 0.0;
            psVar19 = local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar18 = local_98.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (!bVar8) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Failed to read ",0xf);
              pcVar20 = local_120[1];
              if (pcVar20 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x191748);
              }
              else {
                sVar16 = strlen(pcVar20);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar20,sVar16);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
              std::ostream::put('H');
              std::ostream::flush();
              psVar19 = local_98.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar18 = local_98.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          for (; pbVar6 = local_b8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
              path = local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start, psVar19 != psVar18;
              psVar19 = psVar19 + 1) {
            dVar1 = last_modification_time(psVar19);
            if (local_148 < dVar1) {
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(psVar19->_M_dataplus)._M_p,
                                   psVar19->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," has changed since last compilation attempt.",0x2c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              goto LAB_0011fdd4;
            }
          }
          for (; pbVar7 = local_d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
              psVar18 = local_d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, path != pbVar6; path = path + 1)
          {
            dVar1 = last_modification_time(path);
            if (local_148 < dVar1) {
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(path->_M_dataplus)._M_p,
                                   path->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," has changed since last compilation attempt.",0x2c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              goto LAB_0011fdd4;
            }
          }
          for (; pbVar6 = local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
              psVar19 = local_f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, psVar18 != pbVar7;
              psVar18 = psVar18 + 1) {
            dVar1 = last_modification_time(psVar18);
            if (local_148 < dVar1) {
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(psVar18->_M_dataplus)._M_p,
                                   psVar18->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," has changed since last compilation attempt.",0x2c);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
              goto LAB_0011fdd4;
            }
          }
          while( true ) {
            if (psVar19 == pbVar6) goto LAB_0011fedc;
            dVar1 = last_modification_time(psVar19);
            if (local_148 < dVar1) break;
            psVar19 = psVar19 + 1;
          }
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(psVar19->_M_dataplus)._M_p,
                               psVar19->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15," has changed since last compilation attempt.",0x2c);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
LAB_0011fdd4:
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"-----------------------------------------------",0x2f);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
          lVar14 = std::chrono::_V2::system_clock::now();
          local_148 = (double)lVar14 / 1000000000.0;
          bVar8 = create_shader_program_from_files(&local_98,&local_b8,&local_d8,&local_f8,&prog_id)
          ;
          if (!bVar8) {
            (*glad_glDeleteProgram)(prog_id);
            prog_id = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"-----------------------------------------------",0x2f)
            ;
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
          }
LAB_0011fedc:
          (*glad_glClearColor)(0.0,0.0,0.0,0.0);
          (*glad_glClear)(0x4100);
          glfwGetFramebufferSize(handle,&width,&height);
          (*glad_glViewport)(0,0,width,height);
          (*glad_glUseProgram)(prog_id);
          if (is_animating == true) {
            lVar14 = std::chrono::_V2::system_clock::now();
            animation_seconds = ((double)lVar14 / 1000000000.0 - last_time) + animation_seconds;
            last_time = (double)lVar14 / 1000000000.0;
          }
          p_Var3 = glad_glUniform1f;
          GVar11 = (*glad_glGetUniformLocation)(prog_id,"animation_seconds");
          (*p_Var3)(GVar11,(float)animation_seconds);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar11 = (*glad_glGetUniformLocation)(prog_id,"proj");
          (*p_Var5)(GVar11,1,'\0',(GLfloat *)&proj);
          p_Var5 = glad_glUniformMatrix4fv;
          GVar11 = (*glad_glGetUniformLocation)(prog_id,"view");
          (*p_Var5)(GVar11,1,'\0',(GLfloat *)&view);
          (*glad_glPolygonMode)(0x408,0x1b02 - wire_frame);
          GVar11 = 0;
          bVar8 = true;
          do {
            bVar21 = bVar8;
            p_Var4 = glad_glUniform1i;
            GVar12 = (*glad_glGetUniformLocation)(prog_id,"is_moon");
            (*p_Var4)(GVar12,GVar11);
            (*glad_glBindVertexArray)(VAO);
            (*glad_glDrawElements)
                      (0xe,(int)F.
                                super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>
                                .m_storage.m_rows * 3,0x1405,(void *)0x0);
            (*glad_glBindVertexArray)(0);
            handle = local_150;
            GVar11 = 1;
            bVar8 = false;
          } while (bVar21);
          glfwSwapBuffers(local_150);
          glfwPollEvents();
          lVar14 = std::chrono::_V2::system_clock::now();
          dVar1 = ((double)lVar14 / 1000000000.0 - local_78) * 1000000.0;
          if ((dVar1 < 16666.666666666668) &&
             (uVar13 = (uint)(16666.666666666668 - dVar1), 0 < (int)uVar13)) {
            local_140._M_dataplus._M_p = (pointer)((ulong)uVar13 / 1000000);
            local_140._M_string_length = ((ulong)uVar13 % 1000000) * 1000;
            do {
              iVar9 = nanosleep((timespec *)&local_140,(timespec *)&local_140);
              if (iVar9 != -1) break;
              piVar17 = __errno_location();
            } while (*piVar17 == 4);
          }
          goto LAB_0011f9a8;
        }
        glfwDestroyWindow(handle);
        iVar9 = 0;
        glfwTerminate();
        goto LAB_001201e5;
      }
      lVar14 = 0x28;
      pcVar20 = "Failed to load OpenGL and its extensions";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar20,lVar14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    iVar9 = 1;
    std::ostream::flush();
  }
LAB_001201e5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return iVar9;
}

Assistant:

int main(int argc, char * argv[])
{

  std::vector<std::string> vertex_shader_paths;
  std::vector<std::string> tess_control_shader_paths;
  std::vector<std::string> tess_evaluation_shader_paths;
  std::vector<std::string> fragment_shader_paths;

  // Initialize glfw window
  if(!glfwInit())
  {
    std::cerr<<"Could not initialize glfw"<<std::endl;
     return EXIT_FAILURE;
  }
  const auto & error = [] (int error, const char* description)
  {
    std::cerr<<description<<std::endl;
  };
  glfwSetErrorCallback(error);
  glfwWindowHint(GLFW_SAMPLES, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
  glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
  GLFWwindow* window = glfwCreateWindow(width, height, "shader-pipeline", NULL, NULL);
  if(!window)
  {
    glfwTerminate();
    std::cerr<<"Could not create glfw window"<<std::endl;
    return EXIT_FAILURE;
  }
  std::cout<<R"(
Usage:
  [Click and drag]  to orbit view
  [Scroll]  to translate view in and out
  A,a  toggle animation
  L,l  toggle wireframe rending
  Z,z  reset view to look along z-axis
)";
  glfwSetWindowPos(window,0,0);
  glfwMakeContextCurrent(window);
  // Load OpenGL and its extensions
  if (!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
  {
    std::cerr<<"Failed to load OpenGL and its extensions"<<std::endl;
    return EXIT_FAILURE;
  }
  print_opengl_info(window);
  igl::opengl::report_gl_error("init");


  icosahedron(V,F);
  mesh_to_vao(V,F,VAO);
  igl::opengl::report_gl_error("mesh_to_vao");

  const auto & reshape = [](
    GLFWwindow* window,
    int _width,
    int _height)
  {
    ::width=_width,::height=_height;

    // augh, windows can't handle variables named near and far.
    float nearVal = 0.01;
    float farVal = 100;
    float top = tan(35./360.*M_PI)*nearVal;
    float right = top * (double)::width/(double)::height;
    float left = -right;
    float bottom = -top;
    proj.setConstant(4,4,0.);
    proj(0,0) = (2.0 * nearVal) / (right - left);
    proj(1,1) = (2.0 * nearVal) / (top - bottom);
    proj(0,2) = (right + left) / (right - left);
    proj(1,2) = (top + bottom) / (top - bottom);
    proj(2,2) = -(farVal + nearVal) / (farVal - nearVal);
    proj(3,2) = -1.0;
    proj(2,3) = -(2.0 * farVal * nearVal) / (farVal - nearVal);
  };
  // Set up window resizing
  glfwSetWindowSizeCallback(window,reshape);
  {
    int width_window, height_window;
    glfwGetWindowSize(window, &width_window, &height_window);
    reshape(window,width_window,height_window);
  }

  // Close the window if user presses ESC or CTRL+C
  glfwSetKeyCallback(
    window,
    [](GLFWwindow* window, int key, int scancode, int action, int mods)
    {
      if(key == 256 || (key == 67 && (mods & GLFW_MOD_CONTROL)))
      {
        glfwSetWindowShouldClose(window,true);
      }
    });
  glfwSetCharModsCallback(
    window,
    [](GLFWwindow* window, unsigned int codepoint, int modifier)
    {
      switch(codepoint)
      {
        case 'A':
        case 'a':
          is_animating ^= 1;
          if(is_animating)
          {
            last_time = get_seconds();
          }
          break;
        case 'L':
        case 'l':
          wire_frame ^= 1;
          if (wire_frame) {
            glDisable(GL_CULL_FACE);
          } else {
            glEnable(GL_CULL_FACE);
          }
          break;
        case 'Z':
        case 'z':
          view.matrix().block(0,0,3,3).setIdentity();
          break;
        default:
          std::cout<<"Unrecognized key: "<<(unsigned char) codepoint<<std::endl;
          break;
      }
    });
  glfwSetMouseButtonCallback(
    window,
    [](GLFWwindow * window, int button, int action, int mods)
    {
      mouse_down = action == GLFW_PRESS;
    });
  glfwSetCursorPosCallback(
    window,
    [](GLFWwindow * window, double x, double y)
    {
      static double mouse_last_x = x;
      static double mouse_last_y = y;
      double dx = x-mouse_last_x;
      double dy = y-mouse_last_y;
      if(mouse_down)
      {
        // Two axis valuator with fixed up
        float factor = std::abs(view.matrix()(2,3));
        view.rotate(
          Eigen::AngleAxisf(
            dx*factor/float(width),
            Eigen::Vector3f(0,1,0)));
        view.rotate(
          Eigen::AngleAxisf(
            dy*factor/float(height),
            view.matrix().topLeftCorner(3,3).inverse()*Eigen::Vector3f(1,0,0)));
      }
      mouse_last_x = x;
      mouse_last_y = y;
    });
  glfwSetScrollCallback(window,
    [](GLFWwindow * window, double xoffset, double yoffset)
    {
      view.matrix()(2,3) =
        std::min(std::max(view.matrix()(2,3)+(float)yoffset,-100.0f),-2.0f);
    });

  glEnable(GL_DEPTH_TEST);
  glEnable(GL_CULL_FACE);
  // Force compilation on first iteration through loop
  double time_of_last_shader_compilation = 0;
  double time_of_last_json_load = 0;
  const auto any_changed = 
    [](
        const std::vector<std::string> &paths,
        const double time_of_last_shader_compilation
        )->bool
  {
    for(const auto & path : paths)
    {
      if(last_modification_time(path) > time_of_last_shader_compilation)
      {
        std::cout<<path<<" has changed since last compilation attempt."<<std::endl;
        return true;
      }
    }
    return false;
  };

  float start_time = get_seconds();
  // Main display routine
  while (!glfwWindowShouldClose(window))
  {
    double tic = get_seconds();

    if(any_changed({argv[1]},time_of_last_json_load))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      time_of_last_json_load = get_seconds();
      if(!read_json(argv[1],
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths))
      {
        std::cerr<<"Failed to read "<<argv[1]<<std::endl;
      }
#ifdef USE_SOLUTION
      {
        const auto replace_all = [](std::vector<std::string> & paths)
        {
          for(auto & path : paths)
          {
            find_and_replace_all("/src/","/solution/",path);
          }
        };
        replace_all(vertex_shader_paths);
        replace_all(tess_control_shader_paths);
        replace_all(tess_evaluation_shader_paths);
        replace_all(fragment_shader_paths);
      }
#endif
      // force reload of shaders
      time_of_last_shader_compilation = 0;
    }
    if(
      any_changed(vertex_shader_paths         ,time_of_last_shader_compilation) ||
      any_changed(tess_control_shader_paths   ,time_of_last_shader_compilation) ||
      any_changed(tess_evaluation_shader_paths,time_of_last_shader_compilation) ||
      any_changed(fragment_shader_paths       ,time_of_last_shader_compilation))
    {
      std::cout<<"-----------------------------------------------"<<std::endl;
      // remember the time we tried to compile
      time_of_last_shader_compilation = get_seconds();
      if(
          !create_shader_program_from_files(
            vertex_shader_paths,
            tess_control_shader_paths,
            tess_evaluation_shader_paths,
            fragment_shader_paths,
            prog_id))
      {
        // Force null shader to visually indicate failure
        glDeleteProgram(prog_id);
        prog_id = 0;
        std::cout<<"-----------------------------------------------"<<std::endl;
      }
    }

    // clear screen and set viewport
    glClearColor(0,0,0,0);
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glfwGetFramebufferSize(window, &::width, &::height);
    glViewport(0,0,::width,::height);
    // select program 
    glUseProgram(prog_id);
    // Attach uniforms
    {
      if(is_animating)
      {
        double now = get_seconds();
        animation_seconds += now - last_time;
        last_time = now;
      }
      glUniform1f(glGetUniformLocation(prog_id,"animation_seconds"),animation_seconds);
    }
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"proj"),1,false,proj.data());
    glUniformMatrix4fv(
      glGetUniformLocation(prog_id,"view"),1,false,view.matrix().data());
    // Draw mesh as wireframe
    if(wire_frame)
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);
    }else
    {
      glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    }
    for(int i = 0;i<2;i++)
    {
      glUniform1i(glGetUniformLocation(prog_id, "is_moon"), i==1);
      glBindVertexArray(VAO);
      glDrawElements(GL_PATCHES, F.size(), GL_UNSIGNED_INT, 0);
      glBindVertexArray(0);
    }


    glfwSwapBuffers(window);

    // 60 fps
    {
      glfwPollEvents();
      // In microseconds
      double duration = 1000000.*(get_seconds()-tic);
      const double min_duration = 1000000./60.;
      if(duration<min_duration)
      {
        std::this_thread::sleep_for(std::chrono::microseconds((int)(min_duration-duration)));
      }
    }
  }

  // Graceful exit
  glfwDestroyWindow(window);
  glfwTerminate();
  return EXIT_SUCCESS;
}